

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O1

EdwardsPoint * ecc_edwards_point_new_imported(EdwardsCurve *ec,mp_int *monty_x,mp_int *monty_y)

{
  EdwardsPoint *pEVar1;
  mp_int *pmVar2;
  
  pEVar1 = (EdwardsPoint *)safemalloc(1,0x28,0);
  pEVar1->ec = ec;
  pEVar1->X = (mp_int *)0x0;
  pEVar1->Y = (mp_int *)0x0;
  pEVar1->Z = (mp_int *)0x0;
  pEVar1->T = (mp_int *)0x0;
  pEVar1->X = monty_x;
  pEVar1->Y = monty_y;
  pmVar2 = monty_mul(ec->mc,monty_x,monty_y);
  pEVar1->T = pmVar2;
  pmVar2 = monty_identity(ec->mc);
  pmVar2 = mp_copy(pmVar2);
  pEVar1->Z = pmVar2;
  return pEVar1;
}

Assistant:

static EdwardsPoint *ecc_edwards_point_new_imported(
    EdwardsCurve *ec, mp_int *monty_x, mp_int *monty_y)
{
    EdwardsPoint *ep = ecc_edwards_point_new_empty(ec);
    ep->X = monty_x;
    ep->Y = monty_y;
    ep->T = monty_mul(ec->mc, ep->X, ep->Y);
    ep->Z = mp_copy(monty_identity(ec->mc));
    return ep;
}